

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O0

void __thiscall JsonArray_Empty_Test::JsonArray_Empty_Test(JsonArray_Empty_Test *this)

{
  JsonArray_Empty_Test *this_local;
  
  anon_unknown.dwarf_22945::JsonArray::JsonArray(&this->super_JsonArray);
  (this->super_JsonArray).super_Test._vptr_Test = (_func_int **)&PTR__JsonArray_Empty_Test_00256e78;
  return;
}

Assistant:

TEST_F (JsonArray, Empty) {
    {
        ::testing::InSequence _;
        EXPECT_CALL (callbacks_, begin_array ()).Times (1);
        EXPECT_CALL (callbacks_, end_array ()).Times (1);
    }
    auto p = json::make_parser (proxy_);
    p.input ("[\n]\n"s);
    p.eof ();
    EXPECT_FALSE (p.last_error ()) << "Expected the parse to succeed";
    EXPECT_EQ (p.coordinate (), (json::coord{1U, 3U}));
}